

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O0

void Sat_MmStepEntryRecycle(Sat_MmStep_t *p,char *pEntry,int nBytes)

{
  int nBytes_local;
  char *pEntry_local;
  Sat_MmStep_t *p_local;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    Sat_MmFixedEntryRecycle(p->pMap[nBytes],pEntry);
  }
  return;
}

Assistant:

void Sat_MmStepEntryRecycle( Sat_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Sat_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}